

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O1

unsafe_optional_ptr<Node>
duckdb::GetChildInternal<duckdb::Node_const>(ART *art,Node *node,uint8_t byte)

{
  _Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false> _Var1;
  idx_t iVar2;
  NType NVar3;
  type paVar4;
  pointer pFVar5;
  data_ptr_t pdVar6;
  long *plVar7;
  InternalException *this;
  __hash_code __code;
  Node *pNVar8;
  long *plVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  bool bVar13;
  string local_68;
  string local_48;
  
  uVar10 = (node->super_IndexPointer).data;
  NVar3 = (NType)(uVar10 >> 0x38);
  uVar11 = (uint)(uVar10 >> 0x20);
  switch(NVar3 & 0x7f) {
  case NODE_4:
    paVar4 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
             ::operator*(&art->allocators);
    _Var1._M_head_impl =
         paVar4->_M_elems[2].
         super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
         .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
    plVar7 = *(long **)(*(long *)&((_Var1._M_head_impl)->buffers)._M_h +
                       ((uVar10 & 0xffffffff) %
                       *(size_type *)((long)&(_Var1._M_head_impl)->buffers + 8)) * 8);
    for (plVar9 = (long *)*plVar7; (uVar10 & 0xffffffff) != plVar9[1]; plVar9 = (long *)*plVar9) {
      plVar7 = plVar9;
    }
    pFVar5 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
             ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                           *)(*plVar7 + 0x10));
    pdVar6 = FixedSizeBuffer::Get(pFVar5,true);
    lVar12 = (ulong)(uVar11 & 0xffffff) * (_Var1._M_head_impl)->segment_size;
    iVar2 = (_Var1._M_head_impl)->bitmask_offset;
    if ((ulong)pdVar6[iVar2 + lVar12] != 0) {
      pNVar8 = (Node *)(pdVar6 + lVar12 + iVar2);
      uVar10 = 0;
      do {
        pNVar8 = pNVar8 + 1;
        if (pdVar6[uVar10 + iVar2 + lVar12 + 1] == byte) {
          return (unsafe_optional_ptr<Node>)pNVar8;
        }
        uVar10 = uVar10 + 1;
      } while (pdVar6[iVar2 + lVar12] != uVar10);
    }
    break;
  case NODE_16:
    paVar4 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
             ::operator*(&art->allocators);
    _Var1._M_head_impl =
         paVar4->_M_elems[3].
         super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
         .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
    plVar7 = *(long **)(*(long *)&((_Var1._M_head_impl)->buffers)._M_h +
                       ((uVar10 & 0xffffffff) %
                       *(size_type *)((long)&(_Var1._M_head_impl)->buffers + 8)) * 8);
    for (plVar9 = (long *)*plVar7; (uVar10 & 0xffffffff) != plVar9[1]; plVar9 = (long *)*plVar9) {
      plVar7 = plVar9;
    }
    pFVar5 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
             ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                           *)(*plVar7 + 0x10));
    pdVar6 = FixedSizeBuffer::Get(pFVar5,true);
    lVar12 = (ulong)(uVar11 & 0xffffff) * (_Var1._M_head_impl)->segment_size;
    iVar2 = (_Var1._M_head_impl)->bitmask_offset;
    if ((ulong)pdVar6[iVar2 + lVar12] != 0) {
      pNVar8 = (Node *)(pdVar6 + lVar12 + iVar2 + 0x18);
      uVar10 = 0;
      do {
        if (pdVar6[uVar10 + iVar2 + lVar12 + 1] == byte) {
          return (unsafe_optional_ptr<Node>)pNVar8;
        }
        uVar10 = uVar10 + 1;
        pNVar8 = pNVar8 + 1;
      } while (pdVar6[iVar2 + lVar12] != uVar10);
    }
    break;
  case NODE_48:
    paVar4 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
             ::operator*(&art->allocators);
    _Var1._M_head_impl =
         paVar4->_M_elems[4].
         super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
         .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
    plVar7 = *(long **)(*(long *)&((_Var1._M_head_impl)->buffers)._M_h +
                       ((uVar10 & 0xffffffff) %
                       *(size_type *)((long)&(_Var1._M_head_impl)->buffers + 8)) * 8);
    for (plVar9 = (long *)*plVar7; (uVar10 & 0xffffffff) != plVar9[1]; plVar9 = (long *)*plVar9) {
      plVar7 = plVar9;
    }
    pFVar5 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
             ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                           *)(*plVar7 + 0x10));
    pdVar6 = FixedSizeBuffer::Get(pFVar5,true);
    lVar12 = (_Var1._M_head_impl)->bitmask_offset +
             (ulong)(uVar11 & 0xffffff) * (_Var1._M_head_impl)->segment_size;
    bVar13 = pdVar6[(ulong)byte + 1 + lVar12] == 0x30;
    pNVar8 = (Node *)(pdVar6 + (ulong)pdVar6[(ulong)byte + 1 + lVar12] * 8 + lVar12 + 0x108);
    goto LAB_00c2cc3a;
  case NODE_256:
    paVar4 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
             ::operator*(&art->allocators);
    _Var1._M_head_impl =
         paVar4->_M_elems[5].
         super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
         .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
    plVar7 = *(long **)(*(long *)&((_Var1._M_head_impl)->buffers)._M_h +
                       ((uVar10 & 0xffffffff) %
                       *(size_type *)((long)&(_Var1._M_head_impl)->buffers + 8)) * 8);
    for (plVar9 = (long *)*plVar7; (uVar10 & 0xffffffff) != plVar9[1]; plVar9 = (long *)*plVar9) {
      plVar7 = plVar9;
    }
    pFVar5 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
             ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                           *)(*plVar7 + 0x10));
    pdVar6 = FixedSizeBuffer::Get(pFVar5,true);
    lVar12 = (ulong)byte * 8 +
             (_Var1._M_head_impl)->bitmask_offset +
             (ulong)(uVar11 & 0xffffff) * (_Var1._M_head_impl)->segment_size;
    pNVar8 = (Node *)(pdVar6 + lVar12 + 8);
    bVar13 = pdVar6[lVar12 + 0xf] == '\0';
LAB_00c2cc3a:
    if (bVar13) {
      return (unsafe_optional_ptr<Node>)(Node *)0x0;
    }
    return (unsafe_optional_ptr<Node>)pNVar8;
  default:
    this = (InternalException *)__cxa_allocate_exception(0x10);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"Invalid node type for GetChildInternal: %s.","");
    EnumUtil::ToString<duckdb::NType>(&local_48,NVar3 & 0x7f);
    InternalException::InternalException<std::__cxx11::string>(this,&local_68,&local_48);
    __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  return (unsafe_optional_ptr<Node>)(Node *)0x0;
}

Assistant:

void Node::Free(ART &art, Node &node) {
	if (!node.HasMetadata()) {
		return node.Clear();
	}

	// Free the children.
	auto type = node.GetType();
	switch (type) {
	case NType::PREFIX:
		return Prefix::Free(art, node);
	case NType::LEAF:
		return Leaf::DeprecatedFree(art, node);
	case NType::NODE_4:
		Node4::Free(art, node);
		break;
	case NType::NODE_16:
		Node16::Free(art, node);
		break;
	case NType::NODE_48:
		Node48::Free(art, node);
		break;
	case NType::NODE_256:
		Node256::Free(art, node);
		break;
	case NType::LEAF_INLINED:
		return node.Clear();
	case NType::NODE_7_LEAF:
	case NType::NODE_15_LEAF:
	case NType::NODE_256_LEAF:
		break;
	}

	GetAllocator(art, type).Free(node);
	node.Clear();
}